

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char **value)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *in_RAX;
  size_t sVar1;
  ostream *poVar2;
  char *__s;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  local_28.ptr_ = in_RAX;
  Message::Message((Message *)&local_28);
  __s = *value;
  poVar2 = (ostream *)(local_28.ptr_ + 0x10);
  if (__s == (char *)0x0) {
    sVar1 = 6;
    __s = "(null)";
  }
  else {
    sVar1 = strlen(__s);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar1);
  AppendMessage(this,(Message *)&local_28);
  if (local_28.ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_28.ptr_ + 8))();
  }
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }